

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O3

t_int * sigbiquad_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float *pfVar6;
  t_int tVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  t_bigorsmall32 pun;
  float fVar14;
  
  pfVar6 = (float *)w[3];
  tVar7 = w[4];
  fVar12 = *pfVar6;
  fVar13 = pfVar6[1];
  if (0 < (int)tVar7) {
    fVar1 = pfVar6[2];
    fVar2 = pfVar6[3];
    fVar3 = pfVar6[4];
    fVar4 = pfVar6[5];
    fVar5 = pfVar6[6];
    lVar8 = w[1];
    lVar9 = w[2];
    lVar10 = 0;
    fVar11 = fVar13;
    do {
      fVar13 = fVar12;
      fVar14 = fVar2 * fVar11 + fVar1 * fVar13 + *(float *)(lVar8 + lVar10 * 4);
      fVar12 = 0.0;
      if ((((uint)fVar14 >> 0x1d ^ (uint)fVar14 >> 0x1e) & 1) != 0) {
        fVar12 = fVar14;
      }
      *(float *)(lVar9 + lVar10 * 4) = fVar11 * fVar5 + fVar3 * fVar12 + fVar4 * fVar13;
      lVar10 = lVar10 + 1;
      fVar11 = fVar13;
    } while ((int)tVar7 != (int)lVar10);
  }
  *pfVar6 = fVar12;
  pfVar6[1] = fVar13;
  return w + 5;
}

Assistant:

static t_int *sigbiquad_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    t_biquadctl *c = (t_biquadctl *)(w[3]);
    int n = (int)w[4];
    int i;
    t_sample last = c->c_x1;
    t_sample prev = c->c_x2;
    t_sample fb1 = c->c_fb1;
    t_sample fb2 = c->c_fb2;
    t_sample ff1 = c->c_ff1;
    t_sample ff2 = c->c_ff2;
    t_sample ff3 = c->c_ff3;
    for (i = 0; i < n; i++)
    {
        t_sample output =  *in++ + fb1 * last + fb2 * prev;
        if (PD_BIGORSMALL(output))
            output = 0;
        *out++ = ff1 * output + ff2 * last + ff3 * prev;
        prev = last;
        last = output;
    }
    c->c_x1 = last;
    c->c_x2 = prev;
    return (w+5);
}